

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export_ostream.hpp
# Opt level: O1

ostream_base * __thiscall
pstore::exchange::export_ns::ostream_base::write<4l>(ostream_base *this,span<const_char,_4L> s)

{
  pointer pcVar1;
  pointer pcVar2;
  size_t sVar3;
  char *pcVar4;
  long offset;
  ulong uVar5;
  ulong count;
  span<const_char,__1L> ss;
  storage_type<pstore::gsl::details::extent_type<_1L>_> local_68;
  storage_type<pstore::gsl::details::extent_type<4L>_> local_58;
  span_iterator<pstore::gsl::span<const_char,__1L>,_false> local_50;
  span_iterator<pstore::gsl::span<const_char,__1L>,_false> local_40;
  
  uVar5 = 4;
  offset = 0;
  local_58 = s.storage_.data_;
  while( true ) {
    pcVar1 = (this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    pcVar2 = (this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    sVar3 = buffered_chars(this);
    count = (long)pcVar2 - (long)(pcVar1 + sVar3);
    if (count == 0) {
      sVar3 = buffered_chars(this);
      (*this->_vptr_ostream_base[2])(this,&this->buffer_,sVar3);
      pcVar1 = (this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      pcVar2 = (this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish;
      this->ptr_ = pcVar1;
      count = (long)pcVar2 - (long)pcVar1;
    }
    if (count == 0) {
      assert_failed("available > 0U",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/exchange/export_ostream.hpp"
                    ,0x9c);
    }
    if (uVar5 <= count) {
      count = uVar5;
    }
    if ((long)count < 0) break;
    local_68 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
               gsl::span<const_char,_4L>::subspan((span<const_char,_4L> *)&local_58,offset,count);
    gsl::details::span_iterator<pstore::gsl::span<const_char,_-1L>,_false>::span_iterator
              (&local_50,(span<const_char,__1L> *)&local_68,0);
    gsl::details::span_iterator<pstore::gsl::span<const_char,_-1L>,_false>::span_iterator
              (&local_40,(span<const_char,__1L> *)&local_68,local_68.super_extent_type<_1L>.size_);
    pcVar4 = std::
             copy<pstore::gsl::details::span_iterator<pstore::gsl::span<char_const,_1l>,false>,char*>
                       (&local_50,&local_40,this->ptr_);
    this->ptr_ = pcVar4;
    if (this->end_ < pcVar4) {
      assert_failed("ptr_ <= end_",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/exchange/export_ostream.hpp"
                    ,0xa5);
    }
    offset = offset + count;
    uVar5 = uVar5 - count;
    if (uVar5 == 0) {
      return this;
    }
  }
  assert_failed("count <= unsigned_cast (std::numeric_limits<span_index_type>::max ())",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/exchange/export_ostream.hpp"
                ,0xa2);
}

Assistant:

ostream_base & ostream_base::write (gsl::span<char const, Extent> const s) {
                if (s.empty ()) {
                    return *this;
                }
                auto index = typename gsl::span<char const, Extent>::index_type{0};
                auto remaining = unsigned_cast (s.size ());
                while (remaining > 0U) {
                    // Flush the buffer if it is full.
                    auto available = this->available_space ();
                    if (available == 0U) {
                        available = this->flush ();
                    }
                    PSTORE_ASSERT (available > 0U);

                    // Copy as many characters as we can from the input span to the buffer.
                    auto const count = std::min (remaining, available);
                    using span_index_type = gsl::span<char const>::index_type;
                    PSTORE_ASSERT (count <=
                                   unsigned_cast (std::numeric_limits<span_index_type>::max ()));
                    auto ss = s.subspan (index, static_cast<span_index_type> (count));
                    ptr_ = std::copy (ss.begin (), ss.end (), ptr_);
                    PSTORE_ASSERT (ptr_ <= end_);

                    // Adjust our view of the characters remaining to be copied.
                    remaining -= count;
                    index += count;
                }
                return *this;
            }